

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defineCallOpen.hh
# Opt level: O0

shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
 __thiscall
discordpp::BotStruct::Call::
shared_from_base<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>::GetChannelCall>
          (Call *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
  sVar1;
  enable_shared_from_this<discordpp::BotStruct::Call> local_28;
  Call *this_local;
  
  this_local = this;
  std::enable_shared_from_this<discordpp::BotStruct::Call>::shared_from_this(&local_28);
  std::
  static_pointer_cast<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>>>::GetChannelCall,discordpp::BotStruct::Call>
            ((shared_ptr<discordpp::BotStruct::Call> *)this);
  std::shared_ptr<discordpp::BotStruct::Call>::~shared_ptr
            ((shared_ptr<discordpp::BotStruct::Call> *)&local_28);
  sVar1.
  super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.
  super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall>
          )sVar1.
           super___shared_ptr<discordpp::PluginNative<discordpp::WebsocketSimpleWeb<discordpp::RestSimpleWeb<discordpp::Bot>_>_>::GetChannelCall,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Derived> shared_from_base() {
        return std::static_pointer_cast<Derived>(shared_from_this());
    }